

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O0

bool __thiscall helics::fileops::JsonMapBuilder::clearComponents(JsonMapBuilder *this,int32_t code)

{
  bool bVar1;
  pointer ppVar2;
  int in_ESI;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *in_RDI;
  iterator b;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  int local_14;
  
  local_14 = in_ESI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)0x706459);
    if ((ppVar2->second).second == local_14) break;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_RDI);
  }
  std::
  map<int,std::pair<std::__cxx11::string,int>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
  ::erase_abi_cxx11_(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = std::
          map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          ::empty((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                   *)0x706492);
  return bVar1;
}

Assistant:

bool JsonMapBuilder::clearComponents(int32_t code)
{
    for (auto b = missing_components.begin(); b != missing_components.end(); ++b) {
        if (b->second.second == code) {
            missing_components.erase(b);
            return missing_components.empty();
        }
    }
    return false;
}